

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recenter.h
# Opt level: O2

uint16_t recenter_nonneg(uint16_t r,uint16_t v)

{
  int iVar1;
  undefined2 in_register_00000032;
  uint uVar2;
  undefined6 in_register_0000003a;
  
  uVar2 = CONCAT22(in_register_00000032,v);
  iVar1 = (int)CONCAT62(in_register_0000003a,r);
  if (uVar2 <= (uint)(iVar1 * 2)) {
    if (r <= v) {
      return (v - r) * 2;
    }
    uVar2 = (iVar1 - uVar2) * 2 - 1;
  }
  return (uint16_t)uVar2;
}

Assistant:

static inline uint16_t recenter_nonneg(uint16_t r, uint16_t v) {
  if (v > (r << 1))
    return v;
  else if (v >= r)
    return ((v - r) << 1);
  else
    return ((r - v) << 1) - 1;
}